

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O1

Param * __thiscall
kratos::Generator::parameter
          (Generator *this,string *parameter_name,shared_ptr<kratos::Enum> *enum_def)

{
  Param *pPVar1;
  Generator *local_48;
  element_type *local_40;
  Param *local_38;
  shared_ptr<kratos::Param> ptr;
  
  check_param_name_conflict(this,parameter_name);
  local_40 = (enum_def->super___shared_ptr<kratos::Enum,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_38 = (Param *)0x0;
  local_48 = this;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<kratos::Param,std::allocator<kratos::Param>,kratos::Generator*,std::__cxx11::string_const&,kratos::Enum*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&ptr,&local_38,
             (allocator<kratos::Param> *)
             ((long)&ptr.super___shared_ptr<kratos::Param,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi + 7),&local_48,parameter_name,&local_40);
  std::__shared_ptr<kratos::Param,(__gnu_cxx::_Lock_policy)2>::
  _M_enable_shared_from_this_with<kratos::Param,kratos::Param>
            ((__shared_ptr<kratos::Param,(__gnu_cxx::_Lock_policy)2> *)&local_38,local_38);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Param>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Param>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Param>>>>
  ::_M_emplace_unique<std::__cxx11::string_const&,std::shared_ptr<kratos::Param>&>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Param>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Param>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Param>>>>
              *)&this->params_,parameter_name,(shared_ptr<kratos::Param> *)&local_38);
  pPVar1 = local_38;
  if (ptr.super___shared_ptr<kratos::Param,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               ptr.super___shared_ptr<kratos::Param,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  return pPVar1;
}

Assistant:

Param &Generator::parameter(const std::string &parameter_name,
                            const std::shared_ptr<Enum> &enum_def) {
    check_param_name_conflict(parameter_name);

    auto ptr = std::make_shared<Param>(this, parameter_name, enum_def.get());
    params_.emplace(parameter_name, ptr);
    return *ptr;
}